

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

CurrencyAmount * __thiscall
icu_63::DecimalFormat::parseCurrency
          (DecimalFormat *this,UnicodeString *text,ParsePosition *parsePosition)

{
  UBool UVar1;
  bool bVar2;
  int32_t iVar3;
  int32_t iVar4;
  parse_flags_t parseFlags;
  UErrorCode *pUVar5;
  NumberParserImpl *this_00;
  DecimalFormat *this_01;
  Formattable *output;
  DecimalFormat *local_228;
  ConstChar16Ptr local_1c0;
  undefined1 local_1b1;
  DecimalFormat *local_1b0;
  undefined1 local_1a8 [8];
  Formattable formattable;
  NumberParserImpl *parser;
  int32_t startIndex;
  undefined1 local_118 [8];
  ParsedNumber result;
  ErrorCode status;
  ParsePosition *parsePosition_local;
  UnicodeString *text_local;
  DecimalFormat *this_local;
  
  iVar3 = ParsePosition::getIndex(parsePosition);
  if (-1 < iVar3) {
    iVar3 = ParsePosition::getIndex(parsePosition);
    iVar4 = UnicodeString::length(text);
    if (iVar3 < iVar4) {
      ErrorCode::ErrorCode((ErrorCode *)result.currencyCode);
      numparse::impl::ParsedNumber::ParsedNumber((ParsedNumber *)local_118);
      iVar3 = ParsePosition::getIndex(parsePosition);
      pUVar5 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)result.currencyCode);
      this_00 = getCurrencyParser(this,pUVar5);
      pUVar5 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)result.currencyCode);
      UVar1 = ::U_FAILURE(*pUVar5);
      if (UVar1 == '\0') {
        pUVar5 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)result.currencyCode);
        numparse::impl::NumberParserImpl::parse
                  (this_00,text,iVar3,true,(ParsedNumber *)local_118,pUVar5);
        bVar2 = numparse::impl::ParsedNumber::success((ParsedNumber *)local_118);
        if (bVar2) {
          ParsePosition::setIndex(parsePosition,result.quantity._72_4_);
          Formattable::Formattable((Formattable *)local_1a8);
          parseFlags = numparse::impl::NumberParserImpl::getParseFlags(this_00);
          output = (Formattable *)local_1a8;
          numparse::impl::ParsedNumber::populateFormattable
                    ((ParsedNumber *)local_118,output,parseFlags);
          this_01 = (DecimalFormat *)UMemory::operator_new((UMemory *)0x80,(size_t)output);
          local_228 = (DecimalFormat *)0x0;
          if (this_01 != (DecimalFormat *)0x0) {
            local_1b1 = 1;
            local_1b0 = this_01;
            ConstChar16Ptr::ConstChar16Ptr
                      (&local_1c0,result.suffix.fUnion.fStackFields.fBuffer + 0x17);
            pUVar5 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)result.currencyCode);
            CurrencyAmount::CurrencyAmount
                      ((CurrencyAmount *)this_01,(Formattable *)local_1a8,&local_1c0,pUVar5);
            local_228 = this_01;
          }
          local_1b1 = 0;
          this_local = local_228;
          if (this_01 != (DecimalFormat *)0x0) {
            ConstChar16Ptr::~ConstChar16Ptr(&local_1c0);
          }
          formattable.fBogus.fUnion._52_4_ = 1;
          Formattable::~Formattable((Formattable *)local_1a8);
        }
        else {
          ParsePosition::setErrorIndex(parsePosition,iVar3 + result.quantity._72_4_);
          this_local = (DecimalFormat *)0x0;
          formattable.fBogus.fUnion._52_4_ = 1;
        }
      }
      else {
        this_local = (DecimalFormat *)0x0;
        formattable.fBogus.fUnion._52_4_ = 1;
      }
      numparse::impl::ParsedNumber::~ParsedNumber((ParsedNumber *)local_118);
      ErrorCode::~ErrorCode((ErrorCode *)result.currencyCode);
      return (CurrencyAmount *)this_local;
    }
  }
  return (CurrencyAmount *)(DecimalFormat *)0x0;
}

Assistant:

CurrencyAmount* DecimalFormat::parseCurrency(const UnicodeString& text, ParsePosition& parsePosition) const {
    if (parsePosition.getIndex() < 0 || parsePosition.getIndex() >= text.length()) {
        return nullptr;
    }

    ErrorCode status;
    ParsedNumber result;
    // Note: if this is a currency instance, currencies will be matched despite the fact that we are not in the
    // parseCurrency method (backwards compatibility)
    int32_t startIndex = parsePosition.getIndex();
    const NumberParserImpl* parser = getCurrencyParser(status);
    if (U_FAILURE(status)) { return nullptr; }
    parser->parse(text, startIndex, true, result, status);
    // TODO: Do we need to check for fImpl->properties->parseAllInput (UCONFIG_HAVE_PARSEALLINPUT) here?
    if (result.success()) {
        parsePosition.setIndex(result.charEnd);
        Formattable formattable;
        result.populateFormattable(formattable, parser->getParseFlags());
        return new CurrencyAmount(formattable, result.currencyCode, status);
    } else {
        parsePosition.setErrorIndex(startIndex + result.charEnd);
        return nullptr;
    }
}